

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  uint uVar1;
  EnumDescriptor *this_00;
  DescriptorPool *pDVar2;
  long lVar3;
  double value;
  bool bVar4;
  int iVar5;
  long *plVar6;
  UninterpretedOption *pUVar7;
  DescriptorPool *pDVar8;
  string *psVar9;
  anon_union_8_8_13f84498_for_Symbol_2 aVar10;
  Type type;
  size_type *psVar11;
  uint64 uVar12;
  undefined8 uVar13;
  OptionInterpreter *pOVar14;
  _Alloc_hider _Var15;
  ulong uVar16;
  float value_00;
  double f;
  Symbol SVar17;
  string fully_qualified_name;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(GoogleOnceDynamic **)(option_field + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(option_field + 0x40),FieldDescriptor::TypeOnceInit,
               option_field);
  }
  type = *(Type *)(option_field + 0x48);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)type * 4)) {
  case 1:
    pUVar7 = this->uninterpreted_option_;
    uVar1 = (pUVar7->_has_bits_).has_bits_[0];
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x10) == 0) {
        std::operator+(&local_f8,"Value must be integer for int32 option \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (option_field + 8));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_118.field_2._M_allocated_capacity = *psVar11;
          local_118.field_2._8_8_ = plVar6[3];
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar11;
          local_118._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_118._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
      }
      else {
        uVar16 = pUVar7->negative_int_value_;
        if (-0x80000001 < (long)uVar16) goto LAB_0057e12f;
        std::operator+(&local_f8,"Value out of range for int32 option \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (option_field + 8));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_118.field_2._M_allocated_capacity = *psVar11;
          local_118.field_2._8_8_ = plVar6[3];
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar11;
          local_118._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_118._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
      }
    }
    else {
      uVar16 = pUVar7->positive_int_value_;
      if ((uVar16 & 0xffffffff80000000) == 0) {
LAB_0057e12f:
        iVar5 = *(int *)(option_field + 0x38);
        pOVar14 = *(OptionInterpreter **)(option_field + 0x40);
        if (pOVar14 != (OptionInterpreter *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    ((GoogleOnceDynamic *)pOVar14,FieldDescriptor::TypeOnceInit,option_field);
          type = *(Type *)(option_field + 0x48);
        }
        SetInt32(pOVar14,iVar5,(int32)uVar16,type,unknown_fields);
        return true;
      }
      std::operator+(&local_f8,"Value out of range for int32 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118.field_2._8_8_ = plVar6[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_118._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    }
    break;
  case 2:
    pUVar7 = this->uninterpreted_option_;
    uVar1 = (pUVar7->_has_bits_).has_bits_[0];
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x10) != 0) {
        iVar5 = *(int *)(option_field + 0x38);
        uVar12 = pUVar7->negative_int_value_;
LAB_0057e169:
        pOVar14 = *(OptionInterpreter **)(option_field + 0x40);
        if (pOVar14 != (OptionInterpreter *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    ((GoogleOnceDynamic *)pOVar14,FieldDescriptor::TypeOnceInit,option_field);
          type = *(Type *)(option_field + 0x48);
        }
        SetInt64(pOVar14,iVar5,uVar12,type,unknown_fields);
LAB_0057e835:
        return true;
      }
      std::operator+(&local_f8,"Value must be integer for int64 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118.field_2._8_8_ = plVar6[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_118._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    }
    else {
      uVar12 = pUVar7->positive_int_value_;
      if (-1 < (long)uVar12) {
        iVar5 = *(int *)(option_field + 0x38);
        goto LAB_0057e169;
      }
      std::operator+(&local_f8,"Value out of range for int64 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118.field_2._8_8_ = plVar6[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_118._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    }
    break;
  case 3:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 8) == 0) {
      std::operator+(&local_f8,"Value must be non-negative integer for uint32 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118.field_2._8_8_ = plVar6[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_118._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    }
    else {
      uVar16 = this->uninterpreted_option_->positive_int_value_;
      if (uVar16 >> 0x20 == 0) {
        iVar5 = *(int *)(option_field + 0x38);
        pOVar14 = *(OptionInterpreter **)(option_field + 0x40);
        if (pOVar14 != (OptionInterpreter *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    ((GoogleOnceDynamic *)pOVar14,FieldDescriptor::TypeOnceInit,option_field);
          type = *(Type *)(option_field + 0x48);
        }
        SetUInt32(pOVar14,iVar5,(uint32)uVar16,type,unknown_fields);
        return true;
      }
      std::operator+(&local_f8,"Value out of range for uint32 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      option_field);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118.field_2._8_8_ = plVar6[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_118._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    }
    break;
  case 4:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 8) != 0) {
      iVar5 = *(int *)(option_field + 0x38);
      uVar12 = this->uninterpreted_option_->positive_int_value_;
      pOVar14 = *(OptionInterpreter **)(option_field + 0x40);
      if (pOVar14 != (OptionInterpreter *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                  ((GoogleOnceDynamic *)pOVar14,FieldDescriptor::TypeOnceInit,option_field);
        type = *(Type *)(option_field + 0x48);
      }
      SetUInt64(pOVar14,iVar5,uVar12,type,unknown_fields);
      return true;
    }
    std::operator+(&local_f8,"Value must be non-negative integer for uint64 option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118.field_2._8_8_ = plVar6[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_118._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    break;
  case 5:
    pUVar7 = this->uninterpreted_option_;
    uVar1 = (pUVar7->_has_bits_).has_bits_[0];
    if ((uVar1 & 0x20) != 0) {
      value = pUVar7->double_value_;
LAB_0057e376:
      UnknownFieldSet::AddFixed64(unknown_fields,*(int *)(option_field + 0x38),(uint64)value);
      return true;
    }
    if ((uVar1 & 8) != 0) {
      value = ((double)CONCAT44(0x45300000,(int)(pUVar7->positive_int_value_ >> 0x20)) -
              1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)pUVar7->positive_int_value_) - 4503599627370496.0);
      goto LAB_0057e376;
    }
    if ((uVar1 & 0x10) != 0) {
      value = (double)pUVar7->negative_int_value_;
      goto LAB_0057e376;
    }
    std::operator+(&local_f8,"Value must be number for double option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118.field_2._8_8_ = plVar6[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_118._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    break;
  case 6:
    pUVar7 = this->uninterpreted_option_;
    uVar1 = (pUVar7->_has_bits_).has_bits_[0];
    if ((uVar1 & 0x20) != 0) {
      value_00 = (float)pUVar7->double_value_;
LAB_0057dfb4:
      UnknownFieldSet::AddFixed32(unknown_fields,*(int *)(option_field + 0x38),(uint32)value_00);
      return true;
    }
    if ((uVar1 & 8) != 0) {
      uVar16 = pUVar7->positive_int_value_;
      if ((long)uVar16 < 0) {
        value_00 = (float)uVar16;
      }
      else {
        value_00 = (float)(long)uVar16;
      }
      goto LAB_0057dfb4;
    }
    if ((uVar1 & 0x10) != 0) {
      value_00 = (float)pUVar7->negative_int_value_;
      goto LAB_0057dfb4;
    }
    std::operator+(&local_f8,"Value must be number for float option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118.field_2._8_8_ = plVar6[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_118._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    break;
  case 7:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 1) != 0) {
      iVar5 = std::__cxx11::string::compare
                        ((char *)(this->uninterpreted_option_->identifier_value_).ptr_);
      if (iVar5 == 0) {
        uVar12 = 1;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)(this->uninterpreted_option_->identifier_value_).ptr_);
        if (iVar5 != 0) {
          std::operator+(&local_f8,"Value must be \"true\" or \"false\" for boolean option \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (option_field + 8));
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          psVar11 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_118.field_2._M_allocated_capacity = *psVar11;
            local_118.field_2._8_8_ = plVar6[3];
          }
          else {
            local_118.field_2._M_allocated_capacity = *psVar11;
            local_118._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_118._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          AddError(this->builder_,&this->options_to_interpret_->element_name,
                   &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
          break;
        }
        uVar12 = 0;
      }
      iVar5 = *(int *)(option_field + 0x38);
LAB_0057e82b:
      UnknownFieldSet::AddVarint(unknown_fields,iVar5,uVar12);
      return true;
    }
    std::operator+(&local_f8,"Value must be identifier for boolean option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118.field_2._8_8_ = plVar6[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_118._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    break;
  case 8:
    pUVar7 = this->uninterpreted_option_;
    if (((pUVar7->_has_bits_).has_bits_[0] & 1) == 0) {
      std::operator+(&local_f8,"Value must be identifier for enum-valued option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118.field_2._8_8_ = plVar6[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_118._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
      break;
    }
    if (*(GoogleOnceDynamic **)(option_field + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(option_field + 0x40),FieldDescriptor::TypeOnceInit,
                 option_field);
      pUVar7 = this->uninterpreted_option_;
    }
    this_00 = *(EnumDescriptor **)(option_field + 0x78);
    psVar9 = (pUVar7->identifier_value_).ptr_;
    pDVar2 = *(DescriptorPool **)(*(long *)(this_00 + 0x10) + 0x10);
    pDVar8 = DescriptorPool::generated_pool();
    local_d8 = psVar9;
    if (pDVar2 == pDVar8) {
      aVar10.enum_value_descriptor = EnumDescriptor::FindValueByName(this_00,psVar9);
    }
    else {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      lVar3 = **(long **)(this_00 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,lVar3,(*(long **)(this_00 + 8))[1] + lVar3);
      std::__cxx11::string::resize
                ((ulong)&local_118,
                 (char)local_118._M_string_length - (char)*(undefined8 *)(*(long *)this_00 + 8));
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)(local_d8->_M_dataplus)._M_p);
      SVar17 = FindSymbolNotEnforcingDepsHelper
                         (this->builder_,this->builder_->pool_,&local_118,true);
      aVar10 = SVar17.field_1;
      bVar4 = true;
      if (SVar17.type == ENUM_VALUE) {
        if (*(EnumDescriptor **)(aVar10.descriptor + 0x18) != this_00) {
          std::operator+(&local_50,"Enum type \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (this_00 + 8));
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar11 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_70.field_2._M_allocated_capacity = *psVar11;
            local_70.field_2._8_8_ = plVar6[3];
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          }
          else {
            local_70.field_2._M_allocated_capacity = *psVar11;
            local_70._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_70._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::operator+(&local_d0,&local_70,local_d8);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
          psVar11 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_b0.field_2._M_allocated_capacity = *psVar11;
            local_b0.field_2._8_8_ = plVar6[3];
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar11;
            local_b0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_b0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::operator+(&local_90,&local_b0,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (option_field + 8));
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
          psVar11 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_f8.field_2._M_allocated_capacity = *psVar11;
            local_f8.field_2._8_8_ = plVar6[3];
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar11;
            local_f8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_f8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          AddError(this->builder_,&this->options_to_interpret_->element_name,
                   &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          bVar4 = false;
          aVar10.descriptor = (Descriptor *)0x0;
        }
      }
      else {
        aVar10.descriptor = (Descriptor *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) {
        return false;
      }
    }
    if (aVar10.descriptor != (Descriptor *)0x0) {
      iVar5 = *(int *)(option_field + 0x38);
      uVar12 = (uint64)*(int *)(aVar10.descriptor + 0x10);
      goto LAB_0057e82b;
    }
    if (*(GoogleOnceDynamic **)(option_field + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(option_field + 0x40),FieldDescriptor::TypeOnceInit,
                 option_field);
    }
    std::operator+(&local_70,"Enum type \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (*(long *)(option_field + 0x78) + 8));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0.field_2._8_8_ = plVar6[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::operator+(&local_b0,&local_d0,local_d8);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_90.field_2._M_allocated_capacity = *psVar11;
      local_90.field_2._8_8_ = plVar6[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar11;
      local_90._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::operator+(&local_f8,&local_90,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118.field_2._8_8_ = plVar6[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_118._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    uVar13 = local_70.field_2._M_allocated_capacity;
    _Var15._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return false;
    }
    goto LAB_0057e623;
  case 9:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 2) != 0) {
      psVar9 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                         (unknown_fields,*(int *)(option_field + 0x38));
      std::__cxx11::string::_M_assign((string *)psVar9);
      return true;
    }
    std::operator+(&local_f8,"Value must be quoted string for string option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118.field_2._8_8_ = plVar6[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_118._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    break;
  case 10:
    bVar4 = SetAggregateOption(this,option_field,unknown_fields);
    if (!bVar4) {
      return false;
    }
    return true;
  default:
    goto LAB_0057e835;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  uVar13 = local_f8.field_2._M_allocated_capacity;
  _Var15._M_p = local_f8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_0057e623:
    operator_delete(_Var15._M_p,uVar13 + 1);
  }
  return false;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetOptionValue(
    const FieldDescriptor* option_field,
    UnknownFieldSet* unknown_fields) {
  // We switch on the CppType to validate.
  switch (option_field->cpp_type()) {

    case FieldDescriptor::CPPTYPE_INT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64>(kint32max)) {
          return AddValueError("Value out of range for int32 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        if (uninterpreted_option_->negative_int_value() <
            static_cast<int64>(kint32min)) {
          return AddValueError("Value out of range for int32 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->negative_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError("Value must be integer for int32 option \"" +
                             option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_INT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64>(kint64max)) {
          return AddValueError("Value out of range for int64 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt64(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        SetInt64(option_field->number(),
                 uninterpreted_option_->negative_int_value(),
                 option_field->type(), unknown_fields);
      } else {
        return AddValueError("Value must be integer for int64 option \"" +
                             option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() > kuint32max) {
          return AddValueError("Value out of range for uint32 option \"" +
                               option_field->name() + "\".");
        } else {
          SetUInt32(option_field->number(),
                    uninterpreted_option_->positive_int_value(),
                    option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError("Value must be non-negative integer for uint32 "
                             "option \"" + option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        SetUInt64(option_field->number(),
                  uninterpreted_option_->positive_int_value(),
                  option_field->type(), unknown_fields);
      } else {
        return AddValueError("Value must be non-negative integer for uint64 "
                             "option \"" + option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else {
        return AddValueError("Value must be number for float option \"" +
                             option_field->full_name() + "\".");
      }
      unknown_fields->AddFixed32(option_field->number(),
          google::protobuf::internal::WireFormatLite::EncodeFloat(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else {
        return AddValueError("Value must be number for double option \"" +
                             option_field->full_name() + "\".");
      }
      unknown_fields->AddFixed64(option_field->number(),
          google::protobuf::internal::WireFormatLite::EncodeDouble(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_BOOL:
      uint64 value;
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError("Value must be identifier for boolean option "
                             "\"" + option_field->full_name() + "\".");
      }
      if (uninterpreted_option_->identifier_value() == "true") {
        value = 1;
      } else if (uninterpreted_option_->identifier_value() == "false") {
        value = 0;
      } else {
        return AddValueError("Value must be \"true\" or \"false\" for boolean "
                             "option \"" + option_field->full_name() + "\".");
      }
      unknown_fields->AddVarint(option_field->number(), value);
      break;

    case FieldDescriptor::CPPTYPE_ENUM: {
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError("Value must be identifier for enum-valued option "
                             "\"" + option_field->full_name() + "\".");
      }
      const EnumDescriptor* enum_type = option_field->enum_type();
      const string& value_name = uninterpreted_option_->identifier_value();
      const EnumValueDescriptor* enum_value = NULL;

      if (enum_type->file()->pool() != DescriptorPool::generated_pool()) {
        // Note that the enum value's fully-qualified name is a sibling of the
        // enum's name, not a child of it.
        string fully_qualified_name = enum_type->full_name();
        fully_qualified_name.resize(fully_qualified_name.size() -
                                    enum_type->name().size());
        fully_qualified_name += value_name;

        // Search for the enum value's descriptor in the builder's pool. Note
        // that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
        // DescriptorPool::FindEnumValueByName() because we're already holding
        // the pool's mutex, and the latter method locks it again.
        Symbol symbol =
          builder_->FindSymbolNotEnforcingDeps(fully_qualified_name);
        if (!symbol.IsNull() && symbol.type == Symbol::ENUM_VALUE) {
          if (symbol.enum_value_descriptor->type() != enum_type) {
            return AddValueError("Enum type \"" + enum_type->full_name() +
                "\" has no value named \"" + value_name + "\" for option \"" +
                option_field->full_name() +
                "\". This appears to be a value from a sibling type.");
          } else {
            enum_value = symbol.enum_value_descriptor;
          }
        }
      } else {
        // The enum type is in the generated pool, so we can search for the
        // value there.
        enum_value = enum_type->FindValueByName(value_name);
      }

      if (enum_value == NULL) {
        return AddValueError("Enum type \"" +
                             option_field->enum_type()->full_name() +
                             "\" has no value named \"" + value_name + "\" for "
                             "option \"" + option_field->full_name() + "\".");
      } else {
        // Sign-extension is not a problem, since we cast directly from int32 to
        // uint64, without first going through uint32.
        unknown_fields->AddVarint(option_field->number(),
          static_cast<uint64>(static_cast<int64>(enum_value->number())));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_STRING:
      if (!uninterpreted_option_->has_string_value()) {
        return AddValueError("Value must be quoted string for string option "
                             "\"" + option_field->full_name() + "\".");
      }
      // The string has already been unquoted and unescaped by the parser.
      unknown_fields->AddLengthDelimited(option_field->number(),
          uninterpreted_option_->string_value());
      break;

    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (!SetAggregateOption(option_field, unknown_fields)) {
        return false;
      }
      break;
  }

  return true;
}